

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_rspn(char *s,char *accept)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = strlen(s);
  sVar3 = 0xffffffffffffffff;
  sVar4 = sVar1;
  do {
    sVar4 = sVar4 - 1;
    if ((long)sVar4 < 1) {
      return sVar1;
    }
    sVar2 = strspn(s + sVar4,accept);
    sVar3 = sVar3 + 1;
  } while (sVar2 != 0);
  return sVar3;
}

Assistant:

size_t
zt_cstr_rspn(const char *s, const char *accept) {
    size_t    len = strlen(s);
    ssize_t   i   = 0;

    zt_assert(s);
    zt_assert(accept);

    for (i = len - 1; i > 0; i--) { /* -1 to skip \0 */
        if (strspn(&s[i], accept) == 0) {
            return (len - i) - 1;                          /* -1 for the first non matching char */
        }
    }
    return len;
}